

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block.cc
# Opt level: O0

void __thiscall leveldb::Block::Iter::Prev(Iter *this)

{
  bool bVar1;
  uint32_t uVar2;
  uint64_t uVar3;
  long in_RDI;
  bool bVar4;
  Iter *in_stack_00000018;
  uint32_t original;
  uint32_t in_stack_ffffffffffffffdc;
  uint7 in_stack_ffffffffffffffe0;
  undefined1 in_stack_ffffffffffffffe7;
  undefined4 in_stack_fffffffffffffff0;
  uint uVar5;
  
  uVar5 = *(uint *)(in_RDI + 0x40);
  while( true ) {
    uVar2 = GetRestartPoint((Iter *)CONCAT17(in_stack_ffffffffffffffe7,in_stack_ffffffffffffffe0),
                            in_stack_ffffffffffffffdc);
    if (uVar2 < uVar5) {
      SeekToRestartPoint((Iter *)CONCAT44(uVar5,in_stack_fffffffffffffff0),
                         (uint32_t)((ulong)in_RDI >> 0x20));
      do {
        bVar1 = ParseNextKey(in_stack_00000018);
        bVar4 = false;
        if (bVar1) {
          uVar3 = NextEntryOffset((Iter *)(ulong)in_stack_ffffffffffffffe0);
          bVar4 = uVar3 < uVar5;
        }
      } while (bVar4);
      return;
    }
    if (*(int *)(in_RDI + 0x44) == 0) break;
    *(int *)(in_RDI + 0x44) = *(int *)(in_RDI + 0x44) + -1;
  }
  *(undefined4 *)(in_RDI + 0x40) = *(undefined4 *)(in_RDI + 0x38);
  *(undefined4 *)(in_RDI + 0x44) = *(undefined4 *)(in_RDI + 0x3c);
  return;
}

Assistant:

void Prev() override {
    assert(Valid());

    // Scan backwards to a restart point before current_
    const uint32_t original = current_;
    while (GetRestartPoint(restart_index_) >= original) {
      if (restart_index_ == 0) {
        // No more entries
        current_ = restarts_;
        restart_index_ = num_restarts_;
        return;
      }
      restart_index_--;
    }

    SeekToRestartPoint(restart_index_);
    do {
      // Loop until end of current entry hits the start of original entry
    } while (ParseNextKey() && NextEntryOffset() < original);
  }